

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>::iterator,_bool>
* __thiscall
phmap::priv::
parallel_hash_set<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::NonStandardLayout_const,int>>>
::
emplace_decomposable_with_hash<phmap::priv::NonStandardLayout,std::piecewise_construct_t_const&,std::tuple<phmap::priv::NonStandardLayout_const&&>,std::tuple<int&&>>
          (pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          parallel_hash_set<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::NonStandardLayout_const,int>>>
          *this,NonStandardLayout *key,size_t hashval,piecewise_construct_t *args,
          tuple<const_phmap::priv::NonStandardLayout_&&> *args_1,tuple<int_&&> *args_2)

{
  pthread_mutex_t *__mutex;
  string *psVar1;
  NonStandardLayout *pNVar2;
  int *piVar3;
  pointer pcVar4;
  long lVar5;
  int iVar6;
  size_t i;
  ctrl_t *pcVar7;
  ctrl_t *pcVar8;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  *this_00;
  long lVar9;
  long lVar10;
  bool bVar11;
  
  lVar9 = (ulong)(((uint)(hashval >> 0x18) & 0xff ^
                  (uint)hashval >> 8 ^ (uint)(hashval >> 0x10) & 0xffff) & 0xf) * 0x70;
  __mutex = (pthread_mutex_t *)(this + lVar9);
  iVar6 = pthread_mutex_lock(__mutex);
  if (iVar6 == 0) {
    this_00 = (raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
               *)(this + lVar9 + 0x28);
    i = raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
        ::_find_key<phmap::priv::NonStandardLayout>(this_00,key,hashval);
    bVar11 = i == 0xffffffffffffffff;
    if (bVar11) {
      i = raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
          ::prepare_insert(this_00,hashval);
      lVar5 = *(long *)((long)__mutex + 0x30);
      lVar10 = i * 0x30;
      pNVar2 = (args_1->super__Tuple_impl<0UL,_const_phmap::priv::NonStandardLayout_&&>).
               super__Head_base<0UL,_const_phmap::priv::NonStandardLayout_&&,_false>._M_head_impl;
      piVar3 = (args_2->super__Tuple_impl<0UL,_int_&&>).super__Head_base<0UL,_int_&&,_false>.
               _M_head_impl;
      psVar1 = (string *)(lVar5 + 8 + lVar10);
      *(undefined ***)(psVar1 + -8) = &PTR__NonStandardLayout_00345320;
      lVar9 = lVar5 + 0x18 + lVar10;
      *(long *)(lVar9 + -0x10) = lVar9;
      pcVar4 = (pNVar2->value)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                (psVar1,pcVar4,pcVar4 + (pNVar2->value)._M_string_length);
      *(int *)(lVar5 + lVar10 + 0x28) = *piVar3;
      raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
      ::set_ctrl(this_00,i,(byte)hashval & 0x7f);
      pcVar7 = this_00->ctrl_;
      pcVar8 = pcVar7 + i;
    }
    else {
      pcVar7 = (ctrl_t *)__mutex[1].__align;
      pcVar8 = pcVar7 + i;
    }
    lVar9 = *(long *)((long)__mutex + 0x30);
    lVar5 = *(long *)((long)__mutex + 0x40);
    (__return_storage_ptr__->first).inner_ = (Inner *)__mutex;
    (__return_storage_ptr__->first).inner_end_ = (Inner *)(this + 0x700);
    (__return_storage_ptr__->first).it_.ctrl_ = pcVar8;
    (__return_storage_ptr__->first).it_.field_1.slot_ = (slot_type *)(i * 0x30 + lVar9);
    (__return_storage_ptr__->first).it_end_.ctrl_ = pcVar7 + lVar5;
    __return_storage_ptr__->second = bVar11;
    pthread_mutex_unlock(__mutex);
    return __return_storage_ptr__;
  }
  std::__throw_system_error(iVar6);
}

Assistant:

std::pair<iterator, bool> emplace_decomposable_with_hash(const K& key, size_t hashval, Args&&... args)
    {
        Inner& inner   = sets_[subidx(hashval)];
        auto&  set     = inner.set_;
        UniqueLock m(inner);
        
        size_t offset = set._find_key(key, hashval);
        if (offset == (size_t)-1) {
            offset = set.prepare_insert(hashval);
            set.emplace_at(offset, std::forward<Args>(args)...);
            set.set_ctrl(offset, H2(hashval));
            return make_rv(&inner, {set.iterator_at(offset), true});
        }
        return make_rv(&inner, {set.iterator_at(offset), false});
    }